

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# broker.cpp
# Opt level: O0

int main(void)

{
  Coach local_8d [8];
  Coach c;
  allocator<char> local_79;
  string local_78;
  undefined1 local_58 [8];
  Player p;
  Game g;
  
  Game::Game((Game *)&p.game);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"Marcus",&local_79);
  Player::Player((Player *)local_58,&local_78,(Game *)&p.game);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  Coach::Coach(local_8d,(Game *)&p.game);
  Player::score((Player *)local_58);
  Player::score((Player *)local_58);
  Player::score((Player *)local_58);
  Player::score((Player *)local_58);
  Player::~Player((Player *)local_58);
  Game::~Game((Game *)&p.game);
  return 0;
}

Assistant:

int main()
{
	Game g;
	Player p{"Marcus", g};
	Coach c{g};
	p.score();
	p.score();
	p.score();
	p.score();

	return 0;
}